

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

SymbolInfo * __thiscall
ZXing::Pdf417::DetectSymbol<ZXing::PointT<double>>
          (SymbolInfo *__return_storage_ptr__,Pdf417 *this,
          BitMatrixCursor<ZXing::PointT<double>_> topCur,int width,int height)

{
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_01;
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  int colWidth;
  int in_R8D;
  float fVar4;
  double dVar5;
  float fVar6;
  double dVar7;
  PointT<double> o;
  PointT<double> o_00;
  PointT<double> rowSkip;
  PointT<double> rowSkip_00;
  array<unsigned_short,_8UL> pat;
  this_t botCur;
  SymbolInfo botSI;
  SymbolInfo topSI;
  
  o.x = -topCur.d.y * (double)(width / 2);
  o.y = (double)(width / 2) * topCur.d.x;
  BitMatrixCursor<ZXing::PointT<double>_>::movedBy(&botCur,&topCur,o);
  colWidth = (int)this;
  pat = BitMatrixCursor<ZXing::PointT<double>>::readPatternFromBlack<std::array<unsigned_short,8ul>>
                  ((BitMatrixCursor<ZXing::PointT<double>> *)&botCur,1,
                   (int)((long)((ulong)(uint)(colWidth >> 0x1f) << 0x20 | (ulong)this & 0xffffffff)
                        / 3));
  botCur.img = (BitMatrix *)&pat;
  botCur.p.x._0_4_ = 8;
  botCur.p.y = 0.0;
  botCur.d.x = 0.0;
  dVar5 = IsPattern<false,8,17>
                    ((PatternView *)&botCur,(FixedPattern<8,_17,_false> *)START_PATTERN,0,0.0,0.0);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    uVar1 = Reduce<std::array<unsigned_short,8ul>,unsigned_short,std::plus<unsigned_short>>(&pat,0);
    fVar4 = (float)uVar1 / 17.0;
    fVar6 = 1.0;
    if (1.0 <= fVar4) {
      fVar6 = fVar4;
    }
    dVar5 = ABS(topCur.d.x);
    if (ABS(topCur.d.x) <= ABS(topCur.d.y)) {
      dVar5 = ABS(topCur.d.y);
    }
    dVar7 = (-topCur.d.y / dVar5) * (double)fVar6;
    dVar5 = (topCur.d.x / dVar5) * (double)fVar6;
    o_00.x = -topCur.d.y * (double)(width + -1);
    o_00.y = topCur.d.x * (double)(width + -1);
    BitMatrixCursor<ZXing::PointT<double>_>::movedBy(&botCur,&topCur,o_00);
    topCur_00.p.x = topCur.p.x;
    topCur_00.img = topCur.img;
    topCur_00.p.y = topCur.p.y;
    topCur_00.d.x = topCur.d.x;
    topCur_00.d.y = topCur.d.y;
    rowSkip.y = dVar5;
    rowSkip.x = dVar7;
    ReadSymbolInfo<ZXing::PointT<double>>
              (&topSI,(Pdf417 *)(ulong)(uint)uVar1,topCur_00,rowSkip,colWidth,width,in_R8D);
    rowSkip_00.x = -dVar7;
    rowSkip_00.y = -dVar5;
    topCur_01.p.x._4_4_ = botCur.p.x._4_4_;
    topCur_01.p.x._0_4_ = botCur.p.x._0_4_;
    topCur_01.img = botCur.img;
    topCur_01.p.y = botCur.p.y;
    topCur_01.d.x = botCur.d.x;
    topCur_01.d.y = botCur.d.y;
    ReadSymbolInfo<ZXing::PointT<double>>
              (&botSI,(Pdf417 *)(ulong)uVar1,topCur_01,rowSkip_00,colWidth,width,in_R8D);
    __return_storage_ptr__->rowHeight = topSI.rowHeight;
    __return_storage_ptr__->firstRow = topSI.firstRow;
    __return_storage_ptr__->lastRow = topSI.lastRow;
    __return_storage_ptr__->ecLevel = topSI.ecLevel;
    __return_storage_ptr__->colWidth = topSI.colWidth;
    __return_storage_ptr__->width = topSI.width;
    __return_storage_ptr__->height = topSI.height;
    __return_storage_ptr__->nRows = topSI.nRows;
    __return_storage_ptr__->nCols = topSI.nCols;
    __return_storage_ptr__->lastRow = botSI.firstRow;
    iVar2 = botSI.firstRow - __return_storage_ptr__->firstRow;
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    __return_storage_ptr__->rowHeight = (float)width / (float)(iVar3 + 1);
    if (topSI.nCols != botSI.nCols) {
      __return_storage_ptr__->nCols =
           (__return_storage_ptr__->colWidth / 2 + colWidth) / __return_storage_ptr__->colWidth + -4
      ;
    }
  }
  else {
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->nRows = 0;
    __return_storage_ptr__->nCols = 0;
    __return_storage_ptr__->firstRow = -1;
    __return_storage_ptr__->lastRow = -1;
    __return_storage_ptr__->ecLevel = -1;
    __return_storage_ptr__->colWidth = 0;
    __return_storage_ptr__->rowHeight = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

SymbolInfo DetectSymbol(BitMatrixCursor<POINT> topCur, int width, int height)
{
	auto pat = topCur.movedBy(height / 2 * topCur.right()).template readPatternFromBlack<Pattern417>(1, width / 3);
	if (!IsPattern(pat, START_PATTERN))
		return {};
	int colWidth = Reduce(pat);
	auto rowSkip = std::max(colWidth / 17.f, 1.f) * bresenhamDirection(topCur.right());
	auto botCur  = topCur.movedBy((height - 1) * topCur.right());

	auto topSI = ReadSymbolInfo(topCur, rowSkip, colWidth, width, height);
	auto botSI = ReadSymbolInfo(botCur, -rowSkip, colWidth, width, height);

	SymbolInfo res = topSI;
	res.lastRow = botSI.firstRow;
	res.rowHeight = float(height) / (std::abs(res.lastRow - res.firstRow) + 1);
	if (topSI.nCols != botSI.nCols)
		// if there is something fishy with the number of cols (aliasing), guess them from the width
		res.nCols = (width + res.colWidth / 2) / res.colWidth - 4;

	return res;
}